

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

int pcap_compile_nopcap(int snaplen_arg,int linktype_arg,bpf_program *program,char *buf,int optimize
                       ,bpf_u_int32 mask)

{
  pcap_t *p_00;
  int ret;
  pcap_t *p;
  bpf_u_int32 mask_local;
  int optimize_local;
  char *buf_local;
  bpf_program *program_local;
  int linktype_arg_local;
  int snaplen_arg_local;
  
  p_00 = pcap_open_dead(linktype_arg,snaplen_arg);
  if (p_00 == (pcap_t *)0x0) {
    linktype_arg_local = -1;
  }
  else {
    linktype_arg_local = pcap_compile(p_00,program,buf,optimize,mask);
    pcap_close(p_00);
  }
  return linktype_arg_local;
}

Assistant:

int
pcap_compile_nopcap(int snaplen_arg, int linktype_arg,
		    struct bpf_program *program,
	     const char *buf, int optimize, bpf_u_int32 mask)
{
	pcap_t *p;
	int ret;

	p = pcap_open_dead(linktype_arg, snaplen_arg);
	if (p == NULL)
		return (-1);
	ret = pcap_compile(p, program, buf, optimize, mask);
	pcap_close(p);
	return (ret);
}